

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive_manifest.cpp
# Opt level: O2

bool __thiscall
ON_ComponentManifestTableIndex::AddSystemItem
          (ON_ComponentManifestTableIndex *this,ON_ComponentManifestItem_PRIVATE *system_item)

{
  Type TVar1;
  uint sytem_item_index;
  ON_ComponentManifestItem_PRIVATE *pOVar2;
  ON_ComponentManifestItem_PRIVATE **ppOVar3;
  
  if ((system_item != (ON_ComponentManifestItem_PRIVATE *)0x0) &&
     (TVar1 = (system_item->super_ON_ComponentManifestItem).m_component_type,
     TVar1 == this->m_component_type)) {
    sytem_item_index = (system_item->super_ON_ComponentManifestItem).m_index;
    pOVar2 = SystemItemFromIndex(this,sytem_item_index);
    if ((pOVar2 == (ON_ComponentManifestItem_PRIVATE *)0x0) &&
       ((TVar1 != Unset && (system_item->m_manifest_table_sn == 0)))) {
      if (this->m_bIndexedComponent == true) {
        if (0x80000001 < sytem_item_index) {
LAB_003e3742:
          pOVar2 = this->m_last_system_item;
          system_item->m_prev = pOVar2;
          system_item->m_next = (ON_ComponentManifestItem_PRIVATE *)0x0;
          ppOVar3 = &pOVar2->m_next;
          if (pOVar2 == (ON_ComponentManifestItem_PRIVATE *)0x0) {
            ppOVar3 = &this->m_first_system_item;
          }
          *ppOVar3 = system_item;
          this->m_last_system_item = system_item;
          this->m_system_item_count = this->m_system_item_count + 1;
          system_item->m_manifest_table_sn = this->m_manifest_table_sn;
          return true;
        }
      }
      else if (sytem_item_index == 0x80000001) goto LAB_003e3742;
    }
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive_manifest.cpp"
             ,0xc38,"","Invalid system item parameter.");
  return false;
}

Assistant:

bool ON_ComponentManifestTableIndex::AddSystemItem(
  ON_ComponentManifestItem_PRIVATE* system_item
  )
{
  if ( nullptr != system_item
    && system_item->ComponentType() == m_component_type
    && nullptr == SystemItemFromIndex(system_item->Index())
    && 0 == system_item->m_manifest_table_sn
    && ON_ModelComponent::Type::Unset != m_component_type
    )
  {
    const bool bValidSystemComponentIndex
      = m_bIndexedComponent
      ? (system_item->Index() < 0 && system_item->Index() > ON_UNSET_INT_INDEX)
      : (ON_UNSET_INT_INDEX == system_item->Index());
    if (bValidSystemComponentIndex)
    {
      system_item->m_prev = m_last_system_item;
      system_item->m_next = nullptr;
      if (nullptr != m_last_system_item)
        m_last_system_item->m_next = system_item;
      else
        m_first_system_item = system_item;
      m_last_system_item = system_item;
      m_system_item_count++;
      system_item->m_manifest_table_sn = m_manifest_table_sn;
      return true;
    }
  }
  ON_ERROR("Invalid system item parameter.");
  return false;
}